

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O2

Node * __thiscall wasm::DataFlow::Graph::doVisitUnary(Graph *this,Unary *curr)

{
  Node *pNVar1;
  Node *value;
  
  if (curr->op < NegFloat32) {
    pNVar1 = Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
                       ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,curr->value);
    value = expandFromI1(this,pNVar1,(Expression *)curr);
    pNVar1 = value;
    if (value->type != Bad) {
      pNVar1 = Node::makeExpr((Expression *)curr,(Expression *)curr);
      pNVar1 = addNode(this,pNVar1);
      Node::addValue(pNVar1,value);
    }
  }
  else {
    if (1 < curr->op - EqZInt32) {
      pNVar1 = makeVar(this,(Type)(curr->super_SpecificExpression<(wasm::Expression::Id)15>).
                                  super_Expression.type.id);
      return pNVar1;
    }
    pNVar1 = Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*>::visit
                       ((Visitor<wasm::DataFlow::Graph,_wasm::DataFlow::Node_*> *)this,curr->value);
    pNVar1 = expandFromI1(this,pNVar1,(Expression *)curr);
    if (pNVar1->type != Bad) {
      pNVar1 = makeZeroComp(this,pNVar1,true,(Expression *)curr);
      return pNVar1;
    }
  }
  return pNVar1;
}

Assistant:

Node* doVisitUnary(Unary* curr) {
    // First, check if we support this op.
    switch (curr->op) {
      case ClzInt32:
      case ClzInt64:
      case CtzInt32:
      case CtzInt64:
      case PopcntInt32:
      case PopcntInt64: {
        // These are ok as-is.
        // Check if our child is supported.
        auto* value = expandFromI1(visit(curr->value), curr);
        if (value->isBad()) {
          return value;
        }
        // Great, we are supported!
        auto* ret = addNode(Node::makeExpr(curr, curr));
        ret->addValue(value);
        return ret;
      }
      case EqZInt32:
      case EqZInt64: {
        // These can be implemented using a binary.
        // Check if our child is supported.
        auto* value = expandFromI1(visit(curr->value), curr);
        if (value->isBad()) {
          return value;
        }
        // Great, we are supported!
        return makeZeroComp(value, true, curr);
      }
      default: {
        // Anything else is an unknown value.
        return makeVar(curr->type);
      }
    }
  }